

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::LookupBucketFor<unsigned_int>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,uint *Val,DenseSetPair<llvm::DWARFDebugNames::Abbrev> **FoundBucket)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar6;
  int iVar7;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *pDVar8;
  long lVar9;
  bool bVar10;
  uint local_70;
  Abbrev EmptyKey;
  Abbrev TombstoneKey;
  
  iVar1 = *(int *)(this + 0x10);
  if (iVar1 == 0) {
    *FoundBucket = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
    bVar10 = false;
  }
  else {
    lVar4 = *(long *)this;
    sentinelAbbrev();
    DWARFDebugNames::AbbrevMapInfo::getTombstoneKey();
    uVar2 = *Val;
    if ((local_70 == uVar2) ||
       ((uint)EmptyKey.Attributes.
              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == uVar2)) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                    ,0x252,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::DWARFDebugNames::Abbrev, llvm::detail::DenseSetEmpty, llvm::DWARFDebugNames::AbbrevMapInfo, llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>>, KeyT = llvm::DWARFDebugNames::Abbrev, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DWARFDebugNames::AbbrevMapInfo, BucketT = llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>, LookupKeyT = unsigned int]"
                   );
    }
    uVar5 = uVar2 * 0x25;
    iVar7 = 1;
    pDVar6 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0;
    while( true ) {
      uVar5 = uVar5 & iVar1 - 1U;
      lVar9 = (ulong)uVar5 * 0x20;
      pDVar8 = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)(lVar9 + lVar4);
      uVar3 = *(uint *)(lVar4 + lVar9);
      bVar10 = uVar3 == uVar2;
      if (bVar10) break;
      if (uVar3 == local_70) {
        if (pDVar6 != (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0) {
          pDVar8 = pDVar6;
        }
        break;
      }
      if (pDVar6 != (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)0x0) {
        pDVar8 = pDVar6;
      }
      if (uVar3 == (uint)EmptyKey.Attributes.
                         super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pDVar6 = pDVar8;
      }
      uVar5 = uVar5 + iVar7;
      iVar7 = iVar7 + 1;
    }
    *FoundBucket = pDVar8;
    std::
    _Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                     *)&TombstoneKey);
    std::
    _Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
    ::~_Vector_base((_Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                     *)&EmptyKey);
  }
  return bVar10;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }